

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void __thiscall
kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,CombinationalStmtBlock *stmt)

{
  bool bVar1;
  char *__s;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string keyword;
  CombinationalStmtBlock *stmt_local;
  SystemVerilogCodeGen *this_local;
  
  keyword.field_2._8_8_ = stmt;
  bVar1 = CombinationalStmtBlock::is_general_purpose(stmt);
  __s = "always_comb";
  if (bVar1) {
    __s = "always";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,__s,&local_39);
  std::allocator<char>::~allocator(&local_39);
  block_code(this,(string *)local_38,(StmtBlock *)keyword.field_2._8_8_);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(CombinationalStmtBlock* stmt) {
    std::string keyword = stmt->is_general_purpose() ? "always" : "always_comb";
    block_code(keyword, stmt);
}